

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<unsigned_long,unsigned_long>(char *types)

{
  bool bVar1;
  char *pcVar2;
  string msg_2;
  unsigned_long x;
  string msg_1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  unsigned_long ret;
  TestCase<unsigned_long,_unsigned_long,_3> test;
  TestVector<unsigned_long,_unsigned_long,_3> tests;
  unsigned_long in_stack_fffffffffffffd78;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffd80;
  allocator *in_stack_fffffffffffffd88;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd90;
  unsigned_long local_230;
  byte local_220;
  allocator local_211;
  string local_210 [15];
  undefined1 in_stack_fffffffffffffdff;
  unsigned_long in_stack_fffffffffffffe00;
  unsigned_long in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_188;
  unsigned_long local_180;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_e8;
  byte local_da;
  allocator local_d9;
  string local_d8 [55];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [40];
  unsigned_long local_38;
  unsigned_long local_30;
  byte local_28;
  TestVector<unsigned_long,_unsigned_long,_3> local_20;
  
  TestVector<unsigned_long,_unsigned_long,_3>::TestVector(&local_20);
  TestVector<unsigned_long,_unsigned_long,_3>::GetNext
            ((TestVector<unsigned_long,_unsigned_long,_3> *)in_stack_fffffffffffffd90.m_int);
  while( true ) {
    bVar1 = TestVector<unsigned_long,_unsigned_long,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<unsigned_long,unsigned_long>
                      ((unsigned_long)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                       (unsigned_long *)0x179a96);
    if (bVar1 != (bool)(local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Error in case ",&local_a1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar2,&local_d9);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (bool)in_stack_fffffffffffffdff);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::~string(local_60);
    }
    local_da = 1;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_e8,&local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    if ((local_da & 1) != (local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Error in case ",&local_149);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,pcVar2,&local_171);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (bool)in_stack_fffffffffffffdff);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string(local_108);
    }
    local_da = 1;
    local_180 = local_38;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_188,&local_30);
    operator+=((unsigned_long *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
    if ((local_da & 1) != (local_28 & 1)) {
      in_stack_fffffffffffffd90.m_int = (unsigned_long)&stack0xfffffffffffffe17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e8,"Error in case ",(allocator *)in_stack_fffffffffffffd90.m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
      in_stack_fffffffffffffd80 =
           (SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd88 = &local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_210,(char *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (bool)in_stack_fffffffffffffdff);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::__cxx11::string::~string(local_1a8);
    }
    TestVector<unsigned_long,_unsigned_long,_3>::GetNext
              ((TestVector<unsigned_long,_unsigned_long,_3> *)in_stack_fffffffffffffd90.m_int);
    local_38 = local_230;
    local_28 = local_220;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}